

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3BtreeCommitPhaseOne(Btree *p,char *zSuperJrnl)

{
  undefined8 *puVar1;
  undefined8 in_RSI;
  char *in_RDI;
  BtShared *pBt;
  int rc;
  int local_1c;
  int noSync;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  noSync = (int)((ulong)in_RSI >> 0x20);
  local_1c = 0;
  if (in_RDI[0x10] == '\x02') {
    puVar1 = *(undefined8 **)(in_RDI + 8);
    sqlite3BtreeEnter((Btree *)0x13d0bf);
    if ((*(char *)((long)puVar1 + 0x21) == '\0') || (local_1c = autoVacuumCommit(p), local_1c == 0))
    {
      if (*(char *)((long)puVar1 + 0x23) != '\0') {
        sqlite3PagerTruncateImage((Pager *)*puVar1,*(Pgno *)(puVar1 + 8));
      }
      local_1c = sqlite3PagerCommitPhaseOne
                           ((Pager *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                            in_RDI,noSync);
      sqlite3BtreeLeave((Btree *)0x13d132);
    }
    else {
      sqlite3BtreeLeave((Btree *)0x13d0e8);
    }
  }
  return local_1c;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeCommitPhaseOne(Btree *p, const char *zSuperJrnl){
  int rc = SQLITE_OK;
  if( p->inTrans==TRANS_WRITE ){
    BtShared *pBt = p->pBt;
    sqlite3BtreeEnter(p);
#ifndef SQLITE_OMIT_AUTOVACUUM
    if( pBt->autoVacuum ){
      rc = autoVacuumCommit(p);
      if( rc!=SQLITE_OK ){
        sqlite3BtreeLeave(p);
        return rc;
      }
    }
    if( pBt->bDoTruncate ){
      sqlite3PagerTruncateImage(pBt->pPager, pBt->nPage);
    }
#endif
    rc = sqlite3PagerCommitPhaseOne(pBt->pPager, zSuperJrnl, 0);
    sqlite3BtreeLeave(p);
  }
  return rc;
}